

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O0

bool ndiGetBX2HandleAveragingEnabled(ndicapi *pol,int portHandle)

{
  uint local_20;
  int n;
  int i;
  int portHandle_local;
  ndicapi *pol_local;
  
  local_20 = 0;
  while (((int)local_20 < (int)pol->Bx2HandleCount &&
         ((uint)pol->Bx2Handles[(int)local_20] != portHandle))) {
    local_20 = local_20 + 1;
  }
  if (local_20 == pol->Bx2HandleCount) {
    pol_local._7_1_ = false;
  }
  else {
    pol_local._7_1_ = (bool)(pol->Bx2HandleAveragingEnabled[(int)local_20] & 1);
  }
  return pol_local._7_1_;
}

Assistant:

ndicapiExport bool ndiGetBX2HandleAveragingEnabled(ndicapi* pol, int portHandle)
{
  int i, n;

  n = pol->Bx2HandleCount;
  for (i = 0; i < n; i++)
  {
    if (pol->Bx2Handles[i] == portHandle)
    {
      break;
    }
  }
  if (i == n)
  {
    return 0;
  }

  return pol->Bx2HandleAveragingEnabled[i];
}